

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ExpressionResultBuilder::ExprComponents::~ExprComponents(ExprComponents *this)

{
  long in_RDI;
  
  std::__cxx11::string::~string((string *)(in_RDI + 0x48));
  std::__cxx11::string::~string((string *)(in_RDI + 0x28));
  std::__cxx11::string::~string((string *)(in_RDI + 8));
  return;
}

Assistant:

ExprComponents() : shouldNegate( false ) {}